

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.cc
# Opt level: O2

char * __thiscall
CoreML::Specification::SerializedModel::_InternalParse
          (SerializedModel *this,char *ptr,ParseContext *ctx)

{
  uint tag_00;
  bool bVar1;
  string *psVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unknown;
  uint32_t tag;
  char *local_40;
  uint local_34;
  
  local_40 = ptr;
  do {
    bVar1 = google::protobuf::internal::ParseContext::Done(ctx,&local_40);
    if (bVar1) {
      return local_40;
    }
    local_40 = google::protobuf::internal::ReadTag(local_40,&local_34,0);
    tag_00 = local_34;
    if (local_34 >> 3 == 2) {
      if ((char)local_34 != '\x12') goto LAB_001c7727;
      psVar2 = _internal_mutable_model_abi_cxx11_(this);
      local_40 = google::protobuf::internal::InlineGreedyStringParser(psVar2,local_40,ctx);
    }
    else if ((local_34 >> 3 == 1) && ((char)local_34 == '\n')) {
      psVar2 = _internal_mutable_identifier_abi_cxx11_(this);
      local_40 = google::protobuf::internal::InlineGreedyStringParser(psVar2,local_40,ctx);
      bVar1 = google::protobuf::internal::VerifyUTF8(psVar2,(char *)0x0);
      if (!bVar1) {
        return (char *)0x0;
      }
    }
    else {
LAB_001c7727:
      if ((local_34 == 0) || ((local_34 & 7) == 4)) {
        if (local_40 == (char *)0x0) {
          return (char *)0x0;
        }
        (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = local_34 - 1;
        return local_40;
      }
      unknown = google::protobuf::internal::InternalMetadata::
                mutable_unknown_fields<std::__cxx11::string>
                          (&(this->super_MessageLite)._internal_metadata_);
      local_40 = google::protobuf::internal::UnknownFieldParse(tag_00,unknown,local_40,ctx);
    }
    if (local_40 == (char *)0x0) {
      return (char *)0x0;
    }
  } while( true );
}

Assistant:

const char* SerializedModel::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  while (!ctx->Done(&ptr)) {
    uint32_t tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    switch (tag >> 3) {
      // string identifier = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 10)) {
          auto str = _internal_mutable_identifier();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          CHK_(::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, nullptr));
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // bytes model = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 18)) {
          auto str = _internal_mutable_model();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      default:
        goto handle_unusual;
    }  // switch
  handle_unusual:
    if ((tag == 0) || ((tag & 7) == 4)) {
      CHK_(ptr);
      ctx->SetLastTag(tag);
      goto message_done;
    }
    ptr = UnknownFieldParse(
        tag,
        _internal_metadata_.mutable_unknown_fields<std::string>(),
        ptr, ctx);
    CHK_(ptr != nullptr);
  }  // while
message_done:
  return ptr;
failure:
  ptr = nullptr;
  goto message_done;
#undef CHK_
}